

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization_visitor.cpp
# Opt level: O0

void __thiscall optimization_visitor::visit(optimization_visitor *this,LastExpression *ptr)

{
  LastExpression *ptr_local;
  optimization_visitor *this_local;
  
  std::vector<Expr_*,_std::allocator<Expr_*>_>::push_back(&this->exprs->exprs,&ptr->expr);
  (**(ptr->expr->super_Base)._vptr_Base)(ptr->expr,this);
  return;
}

Assistant:

void optimization_visitor::visit(LastExpression* ptr) {
    exprs->exprs.push_back(ptr->expr);
    ptr->expr->accept(this);
}